

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O3

void __thiscall
Buffer_search_very_long_buffer_Test::~Buffer_search_very_long_buffer_Test
          (Buffer_search_very_long_buffer_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Buffer, search_very_long_buffer) {
    auto constexpr noise = std::string_view { "spam" };
    auto constexpr needle = std::string_view { "eggs" };
    auto constexpr n_noise = 20000;

    auto buf = bfy_buffer_init();
    for (size_t i = 0; i < n_noise; ++i) {
        bfy_buffer_add_readonly(&buf, std::data(noise), std::size(noise));
    }
    bfy_buffer_add_readonly(&buf, std::data(needle), std::size(needle));
    for (size_t i = 0; i < n_noise; ++i) {
        bfy_buffer_add_readonly(&buf, std::data(noise), std::size(noise));
    }

    auto pos = size_t {};
    auto constexpr expected_pos = std::size(noise) * n_noise;
    EXPECT_EQ(0, bfy_buffer_search_all(&buf, std::data(needle), std::size(needle), &pos));
    EXPECT_EQ(expected_pos, pos);

    bfy_buffer_destruct(&buf);
}